

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X_usingDTable_bmi2
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2
                 )

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined2 uVar7;
  size_t sVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  BIT_DStream_status BVar12;
  undefined1 *puVar13;
  size_t sVar14;
  undefined1 *puVar15;
  ulong uVar16;
  int iVar17;
  undefined1 *puVar18;
  uint uVar19;
  undefined1 *puVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  void *pvVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 *puVar32;
  bool bVar33;
  size_t sStack_170;
  size_t sStack_160;
  size_t sStack_148;
  size_t *psStack_140;
  size_t *psStack_138;
  size_t *psStack_128;
  size_t *psStack_110;
  BIT_DStream_t BStack_f0;
  BIT_DStream_t BStack_c8;
  BIT_DStream_t BStack_a0;
  BIT_DStream_t BStack_78;
  size_t *psStack_50;
  size_t *psStack_48;
  size_t *psStack_40;
  size_t *psStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar14 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,bmi2);
    return sVar14;
  }
  if (9 < cSrcSize) {
    uVar25 = (ulong)*cSrc;
    uVar26 = (ulong)*(ushort *)((long)cSrc + 2);
    uVar24 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar16 = uVar24 + 6 + uVar25 + uVar26;
    sVar14 = 0xffffffffffffffec;
    if (uVar16 <= cSrcSize) {
      uVar7 = *(undefined2 *)((long)DTable + 2);
      sVar14 = BIT_initDStream(&BStack_78,(void *)((long)cSrc + 6),uVar25);
      if (sVar14 < 0xffffffffffffff89) {
        pvVar29 = (void *)((long)cSrc + uVar25 + 6);
        sVar14 = BIT_initDStream(&BStack_a0,pvVar29,uVar26);
        if (sVar14 < 0xffffffffffffff89) {
          pvVar29 = (void *)((long)pvVar29 + uVar26);
          sVar14 = BIT_initDStream(&BStack_c8,pvVar29,uVar24);
          if ((sVar14 < 0xffffffffffffff89) &&
             (sVar14 = BIT_initDStream(&BStack_f0,(void *)((long)pvVar29 + uVar24),cSrcSize - uVar16
                                      ), sVar14 < 0xffffffffffffff89)) {
            puVar1 = (undefined1 *)((long)dst + maxDstSize);
            puVar15 = (undefined1 *)((long)dst + (maxDstSize - 3));
            uVar16 = maxDstSize + 3 >> 2;
            puVar2 = (undefined1 *)((long)dst + uVar16);
            puVar13 = puVar2 + uVar16;
            puVar3 = puVar13 + uVar16;
            sStack_160 = BStack_78.bitContainer;
            sStack_148 = BStack_a0.bitContainer;
            sStack_170 = BStack_c8.bitContainer;
            bVar11 = -(char)uVar7;
            bVar10 = bVar11 & 0x3f;
            psStack_38 = (size_t *)BStack_a0.limitPtr;
            psStack_40 = (size_t *)BStack_c8.limitPtr;
            psStack_48 = (size_t *)BStack_f0.limitPtr;
            psStack_128 = (size_t *)BStack_78.ptr;
            psStack_140 = (size_t *)BStack_f0.ptr;
            psStack_50 = (size_t *)BStack_78.limitPtr;
            lVar9 = uVar16 * 3;
            bVar33 = true;
            while ((puVar32 = (undefined1 *)((long)dst + lVar9), puVar32 < puVar15 && (bVar33))) {
              uVar24 = (sStack_160 << ((byte)BStack_78.bitsConsumed & 0x3f)) >> bVar10;
              uVar26 = (sStack_148 << ((byte)BStack_a0.bitsConsumed & 0x3f)) >> bVar10;
              uVar30 = (sStack_170 << ((byte)BStack_c8.bitsConsumed & 0x3f)) >> bVar10;
              uVar25 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >> bVar10;
              iVar23 = *(byte *)((long)DTable + uVar24 * 2 + 5) + BStack_78.bitsConsumed;
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              iVar22 = *(byte *)((long)DTable + uVar26 * 2 + 5) + BStack_a0.bitsConsumed;
              *(undefined1 *)((long)dst + uVar16) = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              iVar21 = *(byte *)((long)DTable + uVar30 * 2 + 5) + BStack_c8.bitsConsumed;
              *(undefined1 *)((long)dst + uVar16 * 2) =
                   *(undefined1 *)((long)DTable + uVar30 * 2 + 4);
              uVar26 = (sStack_160 << ((byte)iVar23 & 0x3f)) >> bVar10;
              uVar31 = (sStack_148 << ((byte)iVar22 & 0x3f)) >> bVar10;
              iVar17 = *(byte *)((long)DTable + uVar25 * 2 + 5) + BStack_f0.bitsConsumed;
              uVar30 = (sStack_170 << ((byte)iVar21 & 0x3f)) >> bVar10;
              uVar24 = (BStack_f0.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
              *(undefined1 *)((long)dst + lVar9) = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              iVar23 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar23;
              *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              iVar22 = (uint)*(byte *)((long)DTable + uVar31 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + uVar16 + 1) =
                   *(undefined1 *)((long)DTable + uVar31 * 2 + 4);
              iVar21 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 5) + iVar21;
              *(undefined1 *)((long)dst + uVar16 * 2 + 1) =
                   *(undefined1 *)((long)DTable + uVar30 * 2 + 4);
              iVar17 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar17;
              *(undefined1 *)((long)dst + lVar9 + 1) =
                   *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              uVar24 = (sStack_160 << ((byte)iVar23 & 0x3f)) >> bVar10;
              uVar25 = (sStack_148 << ((byte)iVar22 & 0x3f)) >> bVar10;
              iVar23 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar23;
              uVar26 = (sStack_170 << ((byte)iVar21 & 0x3f)) >> bVar10;
              uVar30 = (BStack_f0.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
              *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              iVar22 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + uVar16 + 2) =
                   *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              iVar21 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar21;
              *(undefined1 *)((long)dst + uVar16 * 2 + 2) =
                   *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              iVar17 = (uint)*(byte *)((long)DTable + uVar30 * 2 + 5) + iVar17;
              *(undefined1 *)((long)dst + lVar9 + 2) =
                   *(undefined1 *)((long)DTable + uVar30 * 2 + 4);
              uVar24 = (sStack_160 << ((byte)iVar23 & 0x3f)) >> bVar10;
              BStack_78.bitsConsumed = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar23;
              *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              uVar24 = (sStack_148 << ((byte)iVar22 & 0x3f)) >> bVar10;
              bVar4 = *(byte *)((long)DTable + uVar24 * 2 + 5);
              *(undefined1 *)((long)dst + uVar16 + 3) =
                   *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              uVar24 = (sStack_170 << ((byte)iVar21 & 0x3f)) >> bVar10;
              bVar5 = *(byte *)((long)DTable + uVar24 * 2 + 5);
              *(undefined1 *)((long)dst + uVar16 * 2 + 3) =
                   *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              uVar24 = (BStack_f0.bitContainer << ((byte)iVar17 & 0x3f)) >> bVar10;
              bVar6 = *(byte *)((long)DTable + uVar24 * 2 + 5);
              *(undefined1 *)((long)dst + lVar9 + 3) =
                   *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              if (psStack_128 < BStack_78.limitPtr) {
                iVar23 = 3;
              }
              else {
                psStack_128 = (size_t *)((long)psStack_128 - (ulong)(BStack_78.bitsConsumed >> 3));
                BStack_78.bitsConsumed = BStack_78.bitsConsumed & 7;
                sStack_160 = *psStack_128;
                iVar23 = 0;
              }
              BStack_a0.bitsConsumed = iVar22 + (uint)bVar4;
              if (BStack_a0.ptr < BStack_a0.limitPtr) {
                iVar22 = 3;
                psStack_138 = (size_t *)BStack_a0.ptr;
              }
              else {
                psStack_138 = (size_t *)((long)BStack_a0.ptr - (ulong)(BStack_a0.bitsConsumed >> 3))
                ;
                BStack_a0.bitsConsumed = BStack_a0.bitsConsumed & 7;
                sStack_148 = *psStack_138;
                iVar22 = 0;
              }
              BStack_c8.bitsConsumed = iVar21 + (uint)bVar5;
              if (BStack_c8.ptr < BStack_c8.limitPtr) {
                iVar21 = 3;
                psStack_110 = (size_t *)BStack_c8.ptr;
              }
              else {
                psStack_110 = (size_t *)((long)BStack_c8.ptr - (ulong)(BStack_c8.bitsConsumed >> 3))
                ;
                BStack_c8.bitsConsumed = BStack_c8.bitsConsumed & 7;
                sStack_170 = *psStack_110;
                iVar21 = 0;
              }
              BStack_f0.bitsConsumed = iVar17 + (uint)bVar6;
              if (psStack_140 < BStack_f0.limitPtr) {
                iVar17 = 3;
              }
              else {
                psStack_140 = (size_t *)((long)psStack_140 - (ulong)(BStack_f0.bitsConsumed >> 3));
                BStack_f0.bitsConsumed = BStack_f0.bitsConsumed & 7;
                BStack_f0.bitContainer = *psStack_140;
                iVar17 = 0;
              }
              dst = (void *)((long)dst + 4);
              bVar33 = ((iVar22 == 0 && iVar23 == 0) && iVar21 == 0) && iVar17 == 0;
              BStack_a0.ptr = (char *)psStack_138;
              BStack_c8.ptr = (char *)psStack_110;
            }
            BStack_78.ptr = (char *)psStack_128;
            BStack_f0.ptr = (char *)psStack_140;
            BStack_78.bitContainer = sStack_160;
            BStack_a0.bitContainer = sStack_148;
            BStack_c8.bitContainer = sStack_170;
            puVar20 = (undefined1 *)((long)dst + uVar16);
            puVar18 = (undefined1 *)((long)dst + uVar16 * 2);
            sVar14 = 0xffffffffffffffec;
            if (puVar18 <= puVar3 && (puVar20 <= puVar13 && dst <= puVar2)) {
              while ((BVar12 = BIT_reloadDStream(&BStack_78), uVar28 = BStack_78.bitsConsumed,
                     dst < puVar2 + -3 && (BVar12 == BIT_DStream_unfinished))) {
                uVar16 = (BStack_78.bitContainer << ((byte)BStack_78.bitsConsumed & 0x3f)) >>
                         (bVar11 & 0x3f);
                iVar22 = *(byte *)((long)DTable + uVar16 * 2 + 5) + BStack_78.bitsConsumed;
                uVar24 = (BStack_78.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar22;
                uVar25 = (BStack_78.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar22;
                uVar16 = (BStack_78.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                BStack_78.bitsConsumed = (uint)*(byte *)((long)DTable + uVar16 * 2 + 5) + iVar22;
                *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                dst = (void *)((long)dst + 4);
              }
              for (; dst < puVar2; dst = (void *)((long)dst + 1)) {
                uVar16 = (BStack_78.bitContainer << ((byte)uVar28 & 0x3f)) >> (bVar11 & 0x3f);
                bVar10 = *(byte *)((long)DTable + uVar16 * 2 + 5);
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                uVar28 = uVar28 + bVar10;
              }
              while ((BVar12 = BIT_reloadDStream(&BStack_a0), uVar27 = BStack_a0.bitsConsumed,
                     puVar20 < puVar13 + -3 && (BVar12 == BIT_DStream_unfinished))) {
                uVar16 = (BStack_a0.bitContainer << ((byte)BStack_a0.bitsConsumed & 0x3f)) >>
                         (bVar11 & 0x3f);
                iVar22 = *(byte *)((long)DTable + uVar16 * 2 + 5) + BStack_a0.bitsConsumed;
                uVar24 = (BStack_a0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                *puVar20 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar22;
                uVar25 = (BStack_a0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                puVar20[1] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar22;
                uVar16 = (BStack_a0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                puVar20[2] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                BStack_a0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar16 * 2 + 5) + iVar22;
                puVar20[3] = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                puVar20 = puVar20 + 4;
              }
              for (; puVar20 < puVar13; puVar20 = puVar20 + 1) {
                uVar16 = (BStack_a0.bitContainer << ((byte)uVar27 & 0x3f)) >> (bVar11 & 0x3f);
                bVar10 = *(byte *)((long)DTable + uVar16 * 2 + 5);
                *puVar20 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                uVar27 = uVar27 + bVar10;
              }
              while ((BVar12 = BIT_reloadDStream(&BStack_c8), uVar19 = BStack_c8.bitsConsumed,
                     puVar18 < puVar3 + -3 && (BVar12 == BIT_DStream_unfinished))) {
                uVar16 = (BStack_c8.bitContainer << ((byte)BStack_c8.bitsConsumed & 0x3f)) >>
                         (bVar11 & 0x3f);
                iVar22 = *(byte *)((long)DTable + uVar16 * 2 + 5) + BStack_c8.bitsConsumed;
                uVar24 = (BStack_c8.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                *puVar18 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar22;
                uVar25 = (BStack_c8.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                puVar18[1] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar22;
                uVar16 = (BStack_c8.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                puVar18[2] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                BStack_c8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar16 * 2 + 5) + iVar22;
                puVar18[3] = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                puVar18 = puVar18 + 4;
              }
              for (; puVar18 < puVar3; puVar18 = puVar18 + 1) {
                uVar16 = (BStack_c8.bitContainer << ((byte)uVar19 & 0x3f)) >> (bVar11 & 0x3f);
                bVar10 = *(byte *)((long)DTable + uVar16 * 2 + 5);
                *puVar18 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                uVar19 = uVar19 + bVar10;
              }
              while ((BVar12 = BIT_reloadDStream(&BStack_f0), puVar32 < puVar15 &&
                     (BVar12 == BIT_DStream_unfinished))) {
                uVar16 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >>
                         (bVar11 & 0x3f);
                iVar22 = *(byte *)((long)DTable + uVar16 * 2 + 5) + BStack_f0.bitsConsumed;
                uVar25 = (BStack_f0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                *puVar32 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar22;
                uVar24 = (BStack_f0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                puVar32[1] = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
                iVar22 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar22;
                uVar16 = (BStack_f0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar11 & 0x3f);
                puVar32[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                BStack_f0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar16 * 2 + 5) + iVar22;
                puVar32[3] = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
                puVar32 = puVar32 + 4;
              }
              for (; puVar32 < puVar1; puVar32 = puVar32 + 1) {
                uVar16 = (BStack_f0.bitContainer << ((byte)BStack_f0.bitsConsumed & 0x3f)) >>
                         (bVar11 & 0x3f);
                BStack_f0.bitsConsumed =
                     BStack_f0.bitsConsumed + *(byte *)((long)DTable + uVar16 * 2 + 5);
                *puVar32 = *(undefined1 *)((long)DTable + uVar16 * 2 + 4);
              }
              sVar8 = 0xffffffffffffffec;
              if (BStack_f0.bitsConsumed != 0x40) {
                maxDstSize = sVar8;
              }
              if (BStack_f0.ptr != BStack_f0.start) {
                maxDstSize = sVar8;
              }
              if (uVar19 != 0x40) {
                maxDstSize = sVar8;
              }
              if (BStack_c8.ptr != BStack_c8.start) {
                maxDstSize = sVar8;
              }
              if (uVar27 != 0x40) {
                maxDstSize = sVar8;
              }
              if (BStack_a0.ptr != BStack_a0.start) {
                maxDstSize = sVar8;
              }
              if (uVar28 != 0x40) {
                maxDstSize = sVar8;
              }
              sVar14 = maxDstSize;
              if (BStack_78.ptr != BStack_78.start) {
                sVar14 = sVar8;
              }
            }
          }
        }
      }
    }
    return sVar14;
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t HUF_decompress4X_usingDTable_bmi2(void* dst, size_t maxDstSize, const void* cSrc, size_t cSrcSize, const HUF_DTable* DTable, int bmi2)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, bmi2);
#endif
}